

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall
NavierStokesBase::level_projector(NavierStokesBase *this,Real dt,Real time,int iteration)

{
  int level;
  pointer pSVar1;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> U_new;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> U_old;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> P_old;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> P_new;
  Projection *this_00;
  TimeCenter TVar2;
  NavierStokesBase *pNVar3;
  MultiFab *rho_half;
  uint uVar4;
  SyncRegister *crse_sync_reg;
  int crse_dt_ratio;
  Real cur_pres_time;
  
  pSVar1 = (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  U_new.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar1->new_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  U_old.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar1->old_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  P_old.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       pSVar1[1].old_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  P_new.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       pSVar1[1].new_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  uVar4 = (this->super_AmrLevel).level;
  crse_sync_reg = (SyncRegister *)0x0;
  if (((int)uVar4 <
       *(int *)&(((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.super_AmrInfo.
                field_0x8c) && (do_sync_proj != 0)) {
    pNVar3 = getLevel(this,uVar4 + 1);
    crse_sync_reg = pNVar3->sync_reg;
    uVar4 = (this->super_AmrLevel).level;
  }
  if ((int)uVar4 < 1) {
    crse_dt_ratio = -1;
  }
  else {
    crse_dt_ratio =
         (((this->super_AmrLevel).parent)->n_cycle).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [uVar4];
  }
  pSVar1 = (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar2 = amrex::StateDescriptor::timeType(pSVar1[1].desc);
  this_00 = projector;
  if (TVar2 == Point) {
    cur_pres_time = pSVar1[1].new_time.stop;
  }
  else {
    cur_pres_time = (pSVar1[1].new_time.start + pSVar1[1].new_time.stop) * 0.5;
  }
  level = (this->super_AmrLevel).level;
  rho_half = get_rho_half_time(this);
  Projection::level_project
            (this_00,level,time,dt,cur_pres_time,&(this->super_AmrLevel).geom,
             (MultiFab *)
             U_old.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
             (MultiFab *)
             U_new.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
             (MultiFab *)
             P_old.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
             (MultiFab *)
             P_new.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,rho_half,crse_sync_reg,
             this->sync_reg,crse_dt_ratio,iteration,have_divu);
  return;
}

Assistant:

void
NavierStokesBase::level_projector (Real dt,
                                   Real time,
                                   int  iteration)
{
    BL_PROFILE_REGION_START("R::NavierStokesBase::level_projector()");
    BL_PROFILE("NavierStokesBase::level_projector()");

    AMREX_ASSERT(iteration > 0);

    MultiFab& U_old = get_old_data(State_Type);
    MultiFab& U_new = get_new_data(State_Type);
    MultiFab& P_old = get_old_data(Press_Type);
    MultiFab& P_new = get_new_data(Press_Type);

    SyncRegister* crse_ptr = 0;

    if (level < parent->finestLevel() && do_sync_proj)
    {
        crse_ptr = &(getLevel(level+1).getSyncReg());
    }

    int        crse_dt_ratio  = (level > 0) ? parent->nCycle(level) : -1;
    const Real cur_pres_time  = state[Press_Type].curTime();

    projector->level_project(level,time,dt,cur_pres_time,
                             geom,U_old,U_new,P_old,P_new,
                             get_rho_half_time(),crse_ptr,sync_reg,
                             crse_dt_ratio,iteration,have_divu);

    BL_PROFILE_REGION_STOP("R::NavierStokesBase::level_projector()");
}